

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 __thiscall
tcu::Texture2DArrayView::sample
          (Texture2DArrayView *this,Sampler *sampler,float s,float t,float r,float lod)

{
  WrapMode numLevels;
  ConstPixelBufferAccess *levels;
  int depth;
  Sampler *in_RDX;
  Vec4 VVar1;
  float lod_local;
  float r_local;
  float t_local;
  float s_local;
  Sampler *sampler_local;
  Texture2DArrayView *this_local;
  
  levels = *(ConstPixelBufferAccess **)&sampler->wrapR;
  numLevels = sampler->wrapS;
  depth = selectLayer((Texture2DArrayView *)sampler,r);
  VVar1 = sampleLevelArray2D((tcu *)this,levels,numLevels,in_RDX,s,t,depth,lod);
  return (Vec4)VVar1.m_data;
}

Assistant:

Vec4 Texture2DArrayView::sample (const Sampler& sampler, float s, float t, float r, float lod) const
{
	return sampleLevelArray2D(m_levels, m_numLevels, sampler, s, t, selectLayer(r), lod);
}